

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O3

void webrtc::FilterAdaptation
               (int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
               float (*e_fft) [65],float (*h_fft_buf) [2080])

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  float *pfVar20;
  int iVar21;
  ulong uVar22;
  float fft [128];
  float local_238 [64];
  undefined1 local_138 [264];
  
  if (0 < num_partitions) {
    iVar21 = x_fft_buf_block_pos * 0x41;
    pfVar20 = h_fft_buf[1] + 1;
    uVar22 = 0;
    do {
      iVar2 = num_partitions * -0x41;
      if ((long)((long)x_fft_buf_block_pos + uVar22) < (long)(ulong)(uint)num_partitions) {
        iVar2 = 0;
      }
      lVar19 = 0;
      do {
        pfVar1 = *x_fft_buf + (iVar2 + iVar21) + lVar19;
        fVar3 = *pfVar1;
        fVar4 = pfVar1[1];
        fVar5 = pfVar1[2];
        fVar6 = pfVar1[3];
        pfVar1 = x_fft_buf[1] + (iVar2 + iVar21) + lVar19;
        fVar7 = *pfVar1;
        fVar8 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar1 = *e_fft + lVar19;
        fVar11 = *pfVar1;
        fVar12 = pfVar1[1];
        fVar13 = pfVar1[2];
        fVar14 = pfVar1[3];
        pfVar1 = e_fft[1] + lVar19;
        fVar15 = *pfVar1;
        fVar16 = pfVar1[1];
        fVar17 = pfVar1[2];
        fVar18 = pfVar1[3];
        local_238[lVar19 * 2 + 4] = fVar5 * fVar13 + fVar9 * fVar17;
        local_238[lVar19 * 2 + 5] = fVar5 * fVar17 - fVar13 * fVar9;
        local_238[lVar19 * 2 + 6] = fVar6 * fVar14 + fVar10 * fVar18;
        local_238[lVar19 * 2 + 7] = fVar6 * fVar18 - fVar14 * fVar10;
        local_238[lVar19 * 2] = fVar3 * fVar11 + fVar7 * fVar15;
        local_238[lVar19 * 2 + 1] = fVar3 * fVar15 - fVar11 * fVar7;
        local_238[lVar19 * 2 + 2] = fVar4 * fVar12 + fVar8 * fVar16;
        local_238[lVar19 * 2 + 3] = fVar4 * fVar16 - fVar12 * fVar8;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x40);
      lVar19 = (long)((int)((long)x_fft_buf_block_pos + uVar22) * 0x41 + iVar2);
      local_238[1] = (*x_fft_buf)[lVar19 + 0x40] * (*e_fft)[0x40] +
                     x_fft_buf[1][lVar19 + 0x40] * e_fft[1][0x40];
      aec_rdft_inverse_128(local_238);
      memset(local_138,0,0x100);
      lVar19 = 0;
      do {
        local_238[lVar19] = local_238[lVar19] * 0.015625;
        local_238[lVar19 + 1] = local_238[lVar19 + 1] * 0.015625;
        local_238[lVar19 + 2] = local_238[lVar19 + 2] * 0.015625;
        local_238[lVar19 + 3] = local_238[lVar19 + 3] * 0.015625;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x40);
      aec_rdft_forward_128(local_238);
      (*h_fft_buf)[uVar22 * 0x41] = local_238[0] + (*h_fft_buf)[uVar22 * 0x41];
      (*h_fft_buf)[uVar22 * 0x41 + 0x40] = local_238[1] + (*h_fft_buf)[uVar22 * 0x41 + 0x40];
      lVar19 = 0;
      do {
        pfVar20[lVar19 + -0x820] = local_238[lVar19 * 2 + 2] + pfVar20[lVar19 + -0x820];
        pfVar20[lVar19] = local_238[lVar19 * 2 + 3] + pfVar20[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x3f);
      uVar22 = uVar22 + 1;
      iVar21 = iVar21 + 0x41;
      pfVar20 = pfVar20 + 0x41;
    } while (uVar22 != (uint)num_partitions);
  }
  return;
}

Assistant:

static void FilterAdaptation(
    int num_partitions,
    int x_fft_buf_block_pos,
    float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
    float e_fft[2][PART_LEN1],
    float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1]) {
  int i, j;
  float fft[PART_LEN2];
  for (i = 0; i < num_partitions; i++) {
    int xPos = (i + x_fft_buf_block_pos) * (PART_LEN1);
    int pos;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * PART_LEN1;
    }

    pos = i * PART_LEN1;

    for (j = 0; j < PART_LEN; j++) {
      fft[2 * j] = MulRe(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                         e_fft[0][j], e_fft[1][j]);
      fft[2 * j + 1] = MulIm(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                             e_fft[0][j], e_fft[1][j]);
    }
    fft[1] =
        MulRe(x_fft_buf[0][xPos + PART_LEN], -x_fft_buf[1][xPos + PART_LEN],
              e_fft[0][PART_LEN], e_fft[1][PART_LEN]);

    aec_rdft_inverse_128(fft);
    memset(fft + PART_LEN, 0, sizeof(float) * PART_LEN);

    // fft scaling
    {
      float scale = 2.0f / PART_LEN2;
      for (j = 0; j < PART_LEN; j++) {
        fft[j] *= scale;
      }
    }
    aec_rdft_forward_128(fft);

    h_fft_buf[0][pos] += fft[0];
    h_fft_buf[0][pos + PART_LEN] += fft[1];

    for (j = 1; j < PART_LEN; j++) {
      h_fft_buf[0][pos + j] += fft[2 * j];
      h_fft_buf[1][pos + j] += fft[2 * j + 1];
    }
  }
}